

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_concat.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::StructConcatBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  pointer ppVar1;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var2;
  __type _Var3;
  pointer puVar4;
  reference this_00;
  pointer pEVar5;
  child_list_t<LogicalType> *pcVar6;
  iterator iVar7;
  InvalidInputException *pIVar8;
  ParameterNotResolvedException *this_01;
  pointer puVar9;
  pointer __x;
  byte bVar10;
  ulong __n;
  allocator local_139;
  string local_138;
  ScalarFunction *local_118;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_110;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_108;
  ulong local_100;
  child_list_t<LogicalType> combined_children;
  child_list_t<LogicalType> local_e0;
  case_insensitive_set_t name_set;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar9 = (arguments->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (arguments->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_118 = bound_function;
  local_110._M_head_impl = (FunctionData *)this;
  if (puVar9 == puVar4) {
    pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&name_set,"struct_concat: At least one argument is required",
               (allocator *)&local_138);
    InvalidInputException::InvalidInputException(pIVar8,(string *)&name_set);
    __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  combined_children.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  combined_children.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  combined_children.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  name_set._M_h._M_buckets = &name_set._M_h._M_single_bucket;
  name_set._M_h._M_bucket_count = 1;
  name_set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  name_set._M_h._M_element_count = 0;
  name_set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  name_set._M_h._M_rehash_policy._M_next_resize = 0;
  name_set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __n = 0;
  bVar10 = 0;
  local_108 = arguments;
  while( true ) {
    if ((ulong)((long)puVar4 - (long)puVar9 >> 3) <= __n) {
      if (!(bool)(bVar10 & name_set._M_h._M_element_count != 0)) {
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  *)&local_e0,
                 &combined_children.
                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                );
        LogicalType::STRUCT((LogicalType *)&local_138,&local_e0);
        LogicalType::operator=
                  (&(local_118->super_BaseScalarFunction).return_type,(LogicalType *)&local_138);
        LogicalType::~LogicalType((LogicalType *)&local_138);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   *)&local_e0);
        _Var2._M_head_impl = (FunctionData *)local_110;
        *local_110._M_head_impl = (_func_int **)0x0;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&name_set._M_h);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   *)&combined_children);
        return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
               (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
               )_Var2._M_head_impl;
      }
      pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_138,"struct_concat: Cannot mix named and unnamed STRUCTs",
                 &local_139);
      InvalidInputException::InvalidInputException(pIVar8,&local_138);
      __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::get<true>(local_108,__n);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    if ((pEVar5->return_type).id_ == UNKNOWN) break;
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    if ((pEVar5->return_type).id_ != STRUCT) {
      pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_138,"struct_concat: Argument at position \"%d\" is not a STRUCT",
                 &local_139);
      InvalidInputException::InvalidInputException<unsigned_long>(pIVar8,&local_138,__n + 1);
      __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_100 = __n;
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    pcVar6 = StructType::GetChildTypes_abi_cxx11_(&pEVar5->return_type);
    ppVar1 = (pcVar6->
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__x = (pcVar6->
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __x != ppVar1; __x = __x + 1) {
      if ((__x->first)._M_string_length == 0) {
        bVar10 = 1;
      }
      else {
        iVar7 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&name_set._M_h,&__x->first);
        if (iVar7.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)iVar7.
                                              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                              ._M_cur + 8),&__x->first);
          pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          if (_Var3) {
            ::std::__cxx11::string::string
                      ((string *)&local_138,
                       "struct_concat: Arguments contain duplicate STRUCT entry \"%s\"",&local_139);
            ::std::__cxx11::string::string((string *)&local_50,(string *)__x);
            InvalidInputException::InvalidInputException<std::__cxx11::string>
                      (pIVar8,&local_138,&local_50);
            __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
          ::std::__cxx11::string::string
                    ((string *)&local_138,
                     "struct_concat: Arguments contain case-insensitive duplicate STRUCT entry \"%s\" and \"%s\""
                     ,&local_139);
          ::std::__cxx11::string::string((string *)&local_70,(string *)__x);
          ::std::__cxx11::string::string
                    ((string *)&local_90,
                     (string *)
                     ((long)iVar7.
                            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ._M_cur + 8));
          InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
                    (pIVar8,&local_138,&local_70,&local_90);
          __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__detail::
        _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)&name_set._M_h,&__x->first);
      }
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   *)&combined_children,__x);
    }
    __n = local_100 + 1;
    puVar9 = (local_108->
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (local_108->
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
  ParameterNotResolvedException::ParameterNotResolvedException(this_01);
  __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,::std::runtime_error::~runtime_error)
  ;
}

Assistant:

static unique_ptr<FunctionData> StructConcatBind(ClientContext &context, ScalarFunction &bound_function,
                                                 vector<unique_ptr<Expression>> &arguments) {

	// collect names and deconflict, construct return type
	if (arguments.empty()) {
		throw InvalidInputException("struct_concat: At least one argument is required");
	}

	child_list_t<LogicalType> combined_children;
	case_insensitive_set_t name_set;

	bool has_unnamed = false;

	for (idx_t arg_idx = 0; arg_idx < arguments.size(); arg_idx++) {
		const auto &arg = arguments[arg_idx];

		if (arg->return_type.id() == LogicalTypeId::UNKNOWN) {
			throw ParameterNotResolvedException();
		}

		if (arg->return_type.id() != LogicalTypeId::STRUCT) {
			throw InvalidInputException("struct_concat: Argument at position \"%d\" is not a STRUCT", arg_idx + 1);
		}

		const auto &child_types = StructType::GetChildTypes(arg->return_type);
		for (const auto &child : child_types) {
			if (!child.first.empty()) {
				auto it = name_set.find(child.first);
				if (it != name_set.end()) {
					if (*it == child.first) {
						throw InvalidInputException("struct_concat: Arguments contain duplicate STRUCT entry \"%s\"",
						                            child.first);
					}
					throw InvalidInputException(
					    "struct_concat: Arguments contain case-insensitive duplicate STRUCT entry \"%s\" and \"%s\"",
					    child.first, *it);
				}
				name_set.insert(child.first);
			} else {
				has_unnamed = true;
			}
			combined_children.push_back(child);
		}
	}

	if (has_unnamed && !name_set.empty()) {
		throw InvalidInputException("struct_concat: Cannot mix named and unnamed STRUCTs");
	}

	bound_function.return_type = LogicalType::STRUCT(combined_children);
	return nullptr;
}